

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bacPtr.c
# Opt level: O3

Vec_Ptr_t * Bac_PtrTransformBoxes(Vec_Ptr_t *vBoxes,Vec_Ptr_t *vGatesNames)

{
  long lVar1;
  Vec_Ptr_t *pVVar2;
  void **ppvVar3;
  Vec_Ptr_t *pVVar4;
  long lVar5;
  int iVar6;
  ulong uVar7;
  
  iVar6 = vBoxes->nSize;
  uVar7 = (ulong)iVar6;
  if ((long)uVar7 < 0) {
    __assert_fail("nCap >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecPtr.h"
                  ,99,"Vec_Ptr_t *Vec_PtrAllocExact(int)");
  }
  pVVar2 = (Vec_Ptr_t *)malloc(0x10);
  pVVar2->nSize = 0;
  pVVar2->nCap = iVar6;
  if (iVar6 == 0) {
    pVVar2->pArray = (void **)0x0;
  }
  else {
    ppvVar3 = (void **)malloc(uVar7 << 3);
    pVVar2->pArray = ppvVar3;
    lVar5 = 0;
    do {
      pVVar4 = Bac_PtrTransformBox((Vec_Ptr_t *)vBoxes->pArray[lVar5],vGatesNames);
      iVar6 = (int)uVar7;
      if ((int)lVar5 == iVar6) {
        if (iVar6 < 0x10) {
          if (pVVar2->pArray == (void **)0x0) {
            ppvVar3 = (void **)malloc(0x80);
          }
          else {
            ppvVar3 = (void **)realloc(pVVar2->pArray,0x80);
          }
          pVVar2->pArray = ppvVar3;
          pVVar2->nCap = 0x10;
          uVar7 = 0x10;
        }
        else {
          uVar7 = (ulong)(uint)(iVar6 * 2);
          if (pVVar2->pArray == (void **)0x0) {
            ppvVar3 = (void **)malloc(uVar7 * 8);
          }
          else {
            ppvVar3 = (void **)realloc(pVVar2->pArray,uVar7 * 8);
          }
          pVVar2->pArray = ppvVar3;
          pVVar2->nCap = iVar6 * 2;
        }
      }
      else {
        ppvVar3 = pVVar2->pArray;
      }
      lVar1 = lVar5 + 1;
      pVVar2->nSize = (int)lVar1;
      ppvVar3[lVar5] = pVVar4;
      lVar5 = lVar1;
    } while (lVar1 < vBoxes->nSize);
  }
  return pVVar2;
}

Assistant:

Vec_Ptr_t * Bac_PtrTransformBoxes( Vec_Ptr_t * vBoxes, Vec_Ptr_t * vGatesNames )
{
    Vec_Ptr_t * vBox; int i;
    Vec_Ptr_t * vNew = Vec_PtrAllocExact( Vec_PtrSize(vBoxes) );
    Vec_PtrForEachEntry( Vec_Ptr_t *, vBoxes, vBox, i )
        Vec_PtrPush( vNew, Bac_PtrTransformBox(vBox, vGatesNames) );
    return vNew;
}